

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.h
# Opt level: O3

Segment * __thiscall
mnf::Manifold::getView<1>(Segment *__return_storage_ptr__,Manifold *this,RefVec *val,size_t i)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  Index IVar3;
  undefined4 extraout_var_00;
  ulong uVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar5;
  undefined4 extraout_var_01;
  
  iVar2 = (*this->_vptr_Manifold[7])(this);
  if (CONCAT44(extraout_var,iVar2) <= i) {
    __assert_fail("i < numberOfSubManifolds() && \"invalid index\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/include/manifolds/Manifold.h"
                  ,0x1a4,"Segment mnf::Manifold::getView(RefVec, size_t) const [D = 1]");
  }
  lVar1 = *(long *)&(val->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8;
  IVar3 = tangentDim(this);
  if (lVar1 != IVar3) {
    __assert_fail("val.size() == getDim<D>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/include/manifolds/Manifold.h"
                  ,0x1a5,"Segment mnf::Manifold::getView(RefVec, size_t) const [D = 1]");
  }
  iVar2 = (*this->_vptr_Manifold[7])(this);
  if (CONCAT44(extraout_var_00,iVar2) <= i) {
    __assert_fail("i < numberOfSubManifolds() && \"invalid index\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/include/manifolds/Manifold.h"
                  ,0x1bc,"Index mnf::Manifold::getStart(size_t) const");
  }
  iVar2 = (*this->_vptr_Manifold[0x10])(this,i);
  uVar4 = CONCAT44(extraout_var_01,iVar2);
  iVar2 = (*this->_vptr_Manifold[7])(this);
  if (i < CONCAT44(extraout_var_02,iVar2)) {
    iVar2 = (*this->_vptr_Manifold[8])(this,i);
    uVar5 = tangentDim((Manifold *)CONCAT44(extraout_var_03,iVar2));
    lVar1 = *(long *)&val->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ;
    (__return_storage_ptr__->
    super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
    ).
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
    .m_data = (PointerType)(lVar1 + uVar4 * 8);
    (__return_storage_ptr__->
    super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
    ).
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
    .m_rows.m_value = uVar5;
    if ((long)uVar5 < 0 && lVar1 != 0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                    "Eigen::MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>, Level = 0]"
                   );
    }
    (__return_storage_ptr__->
    super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
    ).
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
    .m_xpr = val;
    (__return_storage_ptr__->
    super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
    ).
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
    .m_startRow.m_value = uVar4;
    lVar1 = *(long *)&(val->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ).field_0x8;
    (__return_storage_ptr__->
    super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
    ).
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
    .m_outerStride = lVar1;
    if ((-1 < (long)(uVar5 | uVar4)) && ((long)uVar4 <= (long)(lVar1 - uVar5))) {
      return __return_storage_ptr__;
    }
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  __assert_fail("i < numberOfSubManifolds() && \"invalid index\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/include/manifolds/Manifold.h"
                ,0x1d6,"Index mnf::Manifold::getDim(size_t) const");
}

Assistant:

inline Segment Manifold::getView(RefVec val, size_t i) const
{
  mnf_assert(i < numberOfSubManifolds() && "invalid index");
  mnf_assert(val.size() == getDim<D>());
  return val.segment(getStart<D>(i), getDim<D>(i));
}